

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_verify_suback(Curl_easy *data)

{
  MQTT *pMVar1;
  connectdata *pcVar2;
  byte *ptr_00;
  char *ptr;
  CURLcode result;
  mqtt_conn *mqtt;
  connectdata *conn;
  MQTT *mq;
  Curl_easy *data_local;
  
  pMVar1 = (data->req).p.mqtt;
  pcVar2 = data->conn;
  ptr._4_4_ = mqtt_recv_atleast(data,3);
  if (ptr._4_4_ == CURLE_OK) {
    ptr_00 = (byte *)Curl_dyn_ptr(&pMVar1->recvbuf);
    Curl_debug(data,CURLINFO_HEADER_IN,(char *)ptr_00,3);
    if ((((uint)*ptr_00 == ((pcVar2->proto).mqtt.packetid >> 8 & 0xff)) &&
        ((uint)ptr_00[1] == ((pcVar2->proto).mqtt.packetid & 0xff))) && (ptr_00[2] == 0)) {
      mqtt_recv_consume(data,3);
    }
    else {
      Curl_dyn_reset(&pMVar1->recvbuf);
      ptr._4_4_ = CURLE_WEIRD_SERVER_REPLY;
    }
  }
  return ptr._4_4_;
}

Assistant:

static CURLcode mqtt_verify_suback(struct Curl_easy *data)
{
  struct MQTT *mq = data->req.p.mqtt;
  struct connectdata *conn = data->conn;
  struct mqtt_conn *mqtt = &conn->proto.mqtt;
  CURLcode result;
  char *ptr;

  result = mqtt_recv_atleast(data, MQTT_SUBACK_LEN);
  if(result)
    goto fail;

  /* verify SUBACK */
  DEBUGASSERT(Curl_dyn_len(&mq->recvbuf) >= MQTT_SUBACK_LEN);
  ptr = Curl_dyn_ptr(&mq->recvbuf);
  Curl_debug(data, CURLINFO_HEADER_IN, ptr, MQTT_SUBACK_LEN);

  if(((unsigned char)ptr[0]) != ((mqtt->packetid >> 8) & 0xff) ||
     ((unsigned char)ptr[1]) != (mqtt->packetid & 0xff) ||
     ptr[2] != 0x00) {
    Curl_dyn_reset(&mq->recvbuf);
    result = CURLE_WEIRD_SERVER_REPLY;
    goto fail;
  }
  mqtt_recv_consume(data, MQTT_SUBACK_LEN);
fail:
  return result;
}